

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::handleMouse(int theEvent,int theX,int theY,int theFlags,void *theData)

{
  int iVar1;
  int local_54;
  int aBtn;
  int i;
  cvui_context_t *aContext;
  int aEventsUp [3];
  int aEventsDown [3];
  int aButtons [3];
  void *theData_local;
  int theFlags_local;
  int theY_local;
  int theX_local;
  int theEvent_local;
  
  aEventsDown[1] = 0;
  aEventsDown[2] = 1;
  aEventsUp[1] = 1;
  aEventsUp[2] = 3;
  aEventsDown[0] = 2;
  stack0xffffffffffffffbc = 0x600000004;
  aEventsUp[0] = 5;
  for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
    iVar1 = aEventsDown[(long)local_54 + 1];
    if (theEvent == aEventsUp[(long)local_54 + 1]) {
      *(undefined1 *)((long)theData + 0x2a) = 1;
      *(undefined1 *)((long)theData + 0x2b) = 1;
      *(undefined1 *)((long)theData + (long)iVar1 * 3 + 0x21) = 1;
      *(undefined1 *)((long)theData + (long)iVar1 * 3 + 0x22) = 1;
    }
    else if (theEvent == *(int *)((long)&aContext + (long)local_54 * 4 + 4)) {
      *(undefined1 *)((long)theData + 0x29) = 1;
      *(undefined1 *)((long)theData + 0x2b) = 0;
      *(undefined1 *)((long)theData + (long)iVar1 * 3 + 0x20) = 1;
      *(undefined1 *)((long)theData + (long)iVar1 * 3 + 0x22) = 0;
    }
  }
  *(int *)((long)theData + 0x2c) = theX;
  *(int *)((long)theData + 0x30) = theY;
  return;
}

Assistant:

void handleMouse(int theEvent, int theX, int theY, int theFlags, void* theData) {
	int aButtons[3] = { cvui::LEFT_BUTTON, cvui::MIDDLE_BUTTON, cvui::RIGHT_BUTTON };
	int aEventsDown[3] = { cv::EVENT_LBUTTONDOWN, cv::EVENT_MBUTTONDOWN, cv::EVENT_RBUTTONDOWN };
	int aEventsUp[3] = { cv::EVENT_LBUTTONUP, cv::EVENT_MBUTTONUP, cv::EVENT_RBUTTONUP };

	cvui_context_t *aContext = (cvui_context_t *)theData;

	for (int i = 0; i < 3; i++) {
		int aBtn = aButtons[i];

		if (theEvent == aEventsDown[i]) {
			aContext->mouse.anyButton.justPressed = true;
			aContext->mouse.anyButton.pressed = true;
			aContext->mouse.buttons[aBtn].justPressed = true;
			aContext->mouse.buttons[aBtn].pressed = true;

		} else if (theEvent == aEventsUp[i]) {
			aContext->mouse.anyButton.justReleased = true;
			aContext->mouse.anyButton.pressed = false;
			aContext->mouse.buttons[aBtn].justReleased = true;
			aContext->mouse.buttons[aBtn].pressed = false;
		}
	}

	aContext->mouse.position.x = theX;
	aContext->mouse.position.y = theY;
}